

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

Gnuplot * __thiscall Gnuplot::showonscreen(Gnuplot *this)

{
  string local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_40,"set output",&local_19);
  cmd(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_40,"set terminal ",&terminal_std_abi_cxx11_);
  cmd(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return this;
}

Assistant:

Gnuplot& Gnuplot::showonscreen() {
  cmd("set output");
  cmd("set terminal "+ Gnuplot::terminal_std);
  return *this;
}